

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

bool __thiscall QProgressBarPrivate::repaintRequired(QProgressBarPrivate *this)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Orientation OVar6;
  QProgressBar *pQVar7;
  longlong lVar8;
  QStyle *pQVar9;
  QProgressBarPrivate *in_RDI;
  long in_FS_OFFSET;
  double pixelSize;
  int grooveBlock;
  bool percentageChanged;
  int percentageChangeConstant;
  int lastPaintedPercentage;
  int currentPercentage;
  int totalSteps;
  qint64 valueDifference;
  QProgressBar *q;
  QRect groove;
  QStyleOptionProgressBar opt;
  QWidget *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  QString *pQVar10;
  bool local_95;
  int local_84;
  long local_80;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = q_func(in_RDI);
  if (in_RDI->value == in_RDI->lastPaintedValue) {
    local_95 = false;
  }
  else {
    local_80 = (long)in_RDI->value - (long)in_RDI->lastPaintedValue;
    lVar8 = qAbs<long_long>(&local_80);
    if ((in_RDI->value == *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254) ||
       (in_RDI->value == in_RDI->maximum)) {
      local_95 = true;
    }
    else {
      iVar2 = in_RDI->maximum - *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254;
      if (iVar2 == 0) {
        iVar3 = 0;
        iVar4 = 0;
      }
      else {
        iVar3 = ((in_RDI->value - *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254) * 100) /
                iVar2;
        iVar4 = ((in_RDI->lastPaintedValue - *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254) *
                100) / iVar2;
      }
      local_84 = iVar3 - iVar4;
      iVar5 = qAbs<int>(&local_84);
      if ((in_RDI->field_0x264 & 1) != 0) {
        pQVar10 = &in_RDI->format;
        Qt::Literals::StringLiterals::operator____L1
                  (in_stack_fffffffffffffee8,
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        s.m_data._0_4_ = iVar4;
        s.m_size = (qsizetype)pQVar10;
        s.m_data._4_4_ = iVar3;
        bVar1 = QString::contains((QString *)in_stack_fffffffffffffed8,s,CaseInsensitive);
        if (bVar1) {
          local_95 = true;
          goto LAB_00662598;
        }
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)&in_RDI->format,
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        s_00.m_data._0_4_ = iVar4;
        s_00.m_size = (qsizetype)pQVar10;
        s_00.m_data._4_4_ = iVar3;
        bVar1 = QString::contains((QString *)in_stack_fffffffffffffed8,s_00,CaseInsensitive);
        if ((bVar1) && (0 < iVar5)) {
          local_95 = true;
          goto LAB_00662598;
        }
      }
      memset(local_78,0xaa,0x70);
      QStyleOptionProgressBar::QStyleOptionProgressBar((QStyleOptionProgressBar *)0x6624a9);
      (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a8))(pQVar7,local_78);
      pQVar9 = QWidget::style(in_stack_fffffffffffffed8);
      (**(code **)(*(long *)pQVar9 + 0xc0))(pQVar9,0xc,local_78,pQVar7);
      OVar6 = QProgressBar::orientation
                        ((QProgressBar *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (OVar6 == Horizontal) {
        iVar3 = QRect::width((QRect *)in_stack_fffffffffffffed8);
      }
      else {
        iVar3 = QRect::height((QRect *)in_stack_fffffffffffffed8);
      }
      local_95 = (double)iVar2 / (double)iVar3 < (double)lVar8;
      QStyleOptionProgressBar::~QStyleOptionProgressBar
                ((QStyleOptionProgressBar *)CONCAT44(iVar3,in_stack_fffffffffffffee0));
    }
  }
LAB_00662598:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_95;
  }
  __stack_chk_fail();
}

Assistant:

bool QProgressBarPrivate::repaintRequired() const
{
    Q_Q(const QProgressBar);
    if (value == lastPaintedValue)
        return false;

    const qint64 valueDifference = qAbs(qint64(value) - qint64(lastPaintedValue));

    if (value == minimum || value == maximum)
        return true;

    const int totalSteps = maximum - minimum;

    const int currentPercentage = totalSteps ? (value - minimum) * 100 / totalSteps : 0;
    const int lastPaintedPercentage = totalSteps ? (lastPaintedValue - minimum) * 100 / totalSteps
                                                 : 0;

    const int percentageChangeConstant = 1;
    const bool percentageChanged = (qAbs(currentPercentage - lastPaintedPercentage) >= percentageChangeConstant);

    if (textVisible) {
        if (format.contains("%v"_L1))
            return true;
        if (format.contains("%p"_L1) && percentageChanged)
            return true;
    }

    // Check if the bar needs to be repainted based on pixel-level differences
    QStyleOptionProgressBar opt;
    q->initStyleOption(&opt);
    QRect groove = q->style()->subElementRect(QStyle::SE_ProgressBarGroove, &opt, q);
    int grooveBlock = (q->orientation() == Qt::Horizontal) ? groove.width() : groove.height();
    const double pixelSize = static_cast<double>(totalSteps) / grooveBlock;
    return valueDifference > pixelSize;
}